

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

box3f * __thiscall pbrt::Instance::getBounds(box3f *__return_storage_ptr__,Instance *this)

{
  affine3f *a;
  undefined8 uVar1;
  float fVar2;
  vec3f vVar3;
  box3f ob;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  vec3f local_58;
  vec3f local_48;
  box3f local_38;
  
  if (this->haveComputedBounds == true) {
    fVar2 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar2;
    fVar2 = (this->bounds).lower.y;
    uVar1 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar2;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar1;
  }
  else {
    std::mutex::lock(&this->mutex);
    if (this->haveComputedBounds == true) {
      fVar2 = (this->bounds).upper.z;
      (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
      (__return_storage_ptr__->upper).z = fVar2;
      local_70 = (this->bounds).lower.x;
      fStack_6c = (this->bounds).lower.y;
      fStack_68 = (this->bounds).lower.z;
      fStack_64 = (this->bounds).upper.x;
    }
    else {
      (*(((this->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity)._vptr_Entity[3])(&local_70);
      if (((fStack_64 < local_70) || (fStack_60 < fStack_6c)) || (fStack_5c < fStack_68)) {
        (this->bounds).upper.y = fStack_60;
        (this->bounds).upper.z = fStack_5c;
        (this->bounds).lower.x = local_70;
        (this->bounds).lower.y = fStack_6c;
        *(ulong *)&(this->bounds).lower.z = CONCAT44(fStack_64,fStack_68);
        this->haveComputedBounds = true;
        (__return_storage_ptr__->upper).y = fStack_60;
        (__return_storage_ptr__->upper).z = fStack_5c;
      }
      else {
        local_38.lower.x = 3.4028235e+38;
        local_38.lower.y = 3.4028235e+38;
        local_38.lower.z = 3.4028235e+38;
        local_38.upper.x = -3.4028235e+38;
        local_38.upper.y = -3.4028235e+38;
        local_38.upper.z = -3.4028235e+38;
        a = &this->xfm;
        local_58.x = local_70;
        local_58.y = fStack_6c;
        local_58.z = fStack_68;
        vVar3 = math::operator*(a,&local_58);
        local_48.z = vVar3.z;
        local_48._0_8_ = vVar3._0_8_;
        math::box3f::extend(&local_38,&local_48);
        local_58.z = fStack_5c;
        vVar3 = math::operator*(a,&local_58);
        local_48.z = vVar3.z;
        local_48._0_8_ = vVar3._0_8_;
        math::box3f::extend(&local_38,&local_48);
        local_58.x = local_70;
        local_58.y = fStack_60;
        local_58.z = fStack_68;
        vVar3 = math::operator*(a,&local_58);
        local_48.z = vVar3.z;
        local_48._0_8_ = vVar3._0_8_;
        math::box3f::extend(&local_38,&local_48);
        local_58.x = local_70;
        vVar3 = math::operator*(a,&local_58);
        local_48.z = vVar3.z;
        local_48._0_8_ = vVar3._0_8_;
        math::box3f::extend(&local_38,&local_48);
        local_58.x = fStack_64;
        vVar3 = math::operator*(a,&local_58);
        local_48.z = vVar3.z;
        local_48._0_8_ = vVar3._0_8_;
        math::box3f::extend(&local_38,&local_48);
        local_58.x = fStack_64;
        local_58.y = fStack_6c;
        local_58.z = fStack_5c;
        vVar3 = math::operator*(a,&local_58);
        local_48.z = vVar3.z;
        local_48._0_8_ = vVar3._0_8_;
        math::box3f::extend(&local_38,&local_48);
        local_58.z = fStack_68;
        vVar3 = math::operator*(a,&local_58);
        local_48.z = vVar3.z;
        local_48._0_8_ = vVar3._0_8_;
        math::box3f::extend(&local_38,&local_48);
        local_58.z = fStack_5c;
        vVar3 = math::operator*(a,&local_58);
        local_48.z = vVar3.z;
        local_48._0_8_ = vVar3._0_8_;
        math::box3f::extend(&local_38,&local_48);
        (this->bounds).upper.y = local_38.upper.y;
        (this->bounds).upper.z = local_38.upper.z;
        (this->bounds).lower.x = local_38.lower.x;
        (this->bounds).lower.y = local_38.lower.y;
        *(undefined8 *)&(this->bounds).lower.z = local_38._8_8_;
        this->haveComputedBounds = true;
        (__return_storage_ptr__->upper).y = local_38.upper.y;
        (__return_storage_ptr__->upper).z = local_38.upper.z;
        local_70 = local_38.lower.x;
        fStack_6c = local_38.lower.y;
        fStack_68 = local_38.lower.z;
        fStack_64 = local_38.upper.x;
      }
    }
    (__return_storage_ptr__->lower).x = local_70;
    (__return_storage_ptr__->lower).y = fStack_6c;
    (__return_storage_ptr__->lower).z = fStack_68;
    (__return_storage_ptr__->upper).x = fStack_64;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

box3f Instance::getBounds() 
  {
    assert(object);
    
    if (haveComputedBounds) return bounds;

    std::lock_guard<std::mutex> lock(mutex);
    if (haveComputedBounds) return bounds;
    const box3f ob = object->getBounds();
    if (ob.empty()) {
      this->bounds = ob;
      haveComputedBounds = true;
      return ob;
    }

    box3f _bounds = box3f::empty_box();
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    _bounds.extend(xfmPoint(xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    this->bounds = _bounds;
    haveComputedBounds = true;
    return bounds;
  }